

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SizeT PPC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int local_38;
  UInt32 dest;
  UInt32 src;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  
  if (size < 4) {
    data_local = (Byte *)0x0;
  }
  else {
    for (_dest = (Byte *)0x0; _dest <= (Byte *)(size - 4); _dest = _dest + 4) {
      if (((int)(uint)data[(long)_dest] >> 2 == 0x12) && (((data + 3)[(long)_dest] & 3) == 1)) {
        if (encoding == 0) {
          local_38 = -(ip + (int)_dest);
        }
        else {
          local_38 = ip + (int)_dest;
        }
        local_38 = local_38 +
                   ((data[(long)_dest] & 3) << 0x18 | (uint)(data + 1)[(long)_dest] << 0x10 |
                    (uint)(data + 2)[(long)_dest] << 8 | (data + 3)[(long)_dest] & 0xfffffffc);
        data[(long)_dest] = (byte)((uint)local_38 >> 0x18) & 3 | 0x48;
        (data + 1)[(long)_dest] = (Byte)((uint)local_38 >> 0x10);
        (data + 2)[(long)_dest] = (Byte)((uint)local_38 >> 8);
        (data + 3)[(long)_dest] = (data + 3)[(long)_dest] & 3;
        (data + 3)[(long)_dest] = (data + 3)[(long)_dest] | (byte)local_38;
      }
    }
    data_local = _dest;
  }
  return (SizeT)data_local;
}

Assistant:

static SizeT PPC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] >> 2) == 0x12 && (data[i + 3] & 3) == 1)
    {
      UInt32 src = ((UInt32)(data[i + 0] & 3) << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3] & (~3));
      
      UInt32 dest;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      data[i + 0] = (Byte)(0x48 | ((dest >> 24) &  0x3));
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] &= 0x3;
      data[i + 3] |= dest;
    }
  }
  return i;
}